

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize)

{
  undefined8 *puVar1;
  ZSTD_Sequence *pZVar2;
  undefined8 *puVar3;
  BYTE *pBVar4;
  undefined8 *puVar5;
  BYTE **ppBVar6;
  uint uVar7;
  uint uVar8;
  ZSTD_CDict *pZVar9;
  ZSTD_compressedBlockState_t *pZVar10;
  BYTE *pBVar11;
  seqDef *psVar12;
  uint uVar13;
  undefined8 uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  BYTE *pBVar19;
  uint uVar20;
  ulong uVar21;
  uint *puVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  undefined8 *puVar26;
  undefined8 local_60;
  uint local_58 [2];
  ulong local_50;
  size_t local_48;
  undefined8 *local_40;
  ZSTD_Sequence *local_38;
  
  local_40 = (undefined8 *)(blockSize + (long)src);
  pZVar9 = cctx->cdict;
  if (pZVar9 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      local_50 = 0;
      goto LAB_001bc305;
    }
    pZVar9 = (ZSTD_CDict *)&cctx->prefixDict;
  }
  local_50 = (ulong)(uint)pZVar9->dictContentSize;
LAB_001bc305:
  uVar20 = seqPos->idx;
  pZVar10 = (cctx->blockState).prevCBlock;
  local_58[0] = pZVar10->rep[2];
  local_60 = *(ulong *)pZVar10->rep;
  puVar1 = local_40 + -4;
  do {
    uVar21 = (ulong)uVar20;
    pZVar2 = inSeqs + uVar21;
    uVar7 = inSeqs[uVar21].matchLength;
    if (uVar7 == 0) {
      if ((inSeqsSize <= uVar21) || (pZVar2->offset == 0)) goto LAB_001bc64b;
    }
    else if (inSeqsSize <= uVar21) {
LAB_001bc64b:
      pZVar10 = (cctx->blockState).nextCBlock;
      pZVar10->rep[2] = local_58[0];
      *(ulong *)pZVar10->rep = local_60;
      uVar21 = (ulong)pZVar2->litLength;
      if (uVar21 != 0) {
        local_48 = inSeqsSize;
        local_38 = inSeqs;
        memcpy((cctx->seqStore).lit,src,uVar21);
        ppBVar6 = &(cctx->seqStore).lit;
        *ppBVar6 = *ppBVar6 + uVar21;
        src = (void *)((long)src + (ulong)pZVar2->litLength);
        seqPos->posInSrc = seqPos->posInSrc + (ulong)pZVar2->litLength;
      }
      if ((undefined8 *)src != local_40) {
        return 0xffffffffffffffec;
      }
      seqPos->idx = uVar20 + 1;
      return 0;
    }
    uVar15 = pZVar2->offset;
    uVar8 = pZVar2->litLength;
    uVar21 = (ulong)uVar8;
    if ((uVar21 == 0) || (iVar25 = 1, (uint)local_60 != uVar15)) {
      if (local_60._4_4_ == uVar15) {
        iVar25 = 2;
      }
      else {
        if (local_58[0] != uVar15) {
          iVar25 = 0;
          if (uVar21 == 0) {
            iVar25 = (uint)((uint)local_60 - 1 == uVar15) * 3;
          }
          goto LAB_001bc3b7;
        }
        iVar25 = 3;
      }
      iVar25 = iVar25 - (uint)(uVar21 == 0);
    }
LAB_001bc3b7:
    uVar13 = iVar25 - 1;
    if (iVar25 == 0) {
      uVar13 = uVar15 + 2;
    }
    if (uVar13 < 3) {
      uVar15 = (uVar21 == 0) + uVar13;
      if (uVar15 == 0) {
        uVar16 = local_60 >> 0x20;
        puVar22 = local_58;
      }
      else {
        if (uVar15 == 3) {
          uVar18 = (uint)local_60 - 1;
        }
        else {
          uVar18 = local_58[(ulong)uVar15 - 2];
        }
        puVar22 = local_58 + ((ulong)(uVar15 == 1) - 1);
        uVar16 = local_60 & 0xffffffff;
        local_60 = (ulong)uVar18;
      }
    }
    else {
      uVar16 = local_60 & 0xffffffff;
      puVar22 = (uint *)((long)&local_60 + 4);
      local_60 = (ulong)(uVar13 - 2);
    }
    local_58[0] = *puVar22;
    local_60 = local_60 & 0xffffffff | uVar16 << 0x20;
    if ((cctx->appliedParams).validateSequences != 0) {
      uVar17 = (ulong)(uVar7 + uVar8) + seqPos->posInSrc;
      seqPos->posInSrc = uVar17;
      uVar23 = 1L << ((byte)(cctx->appliedParams).cParams.windowLog & 0x3f);
      uVar16 = local_50 + uVar17;
      if (uVar23 < uVar17) {
        uVar16 = uVar23;
      }
      if (uVar7 < (cctx->appliedParams).cParams.minMatch) {
        return 0xffffffffffffffec;
      }
      if (uVar16 + 2 < (ulong)uVar13) {
        return 0xffffffffffffffec;
      }
    }
    if ((cctx->seqStore).maxNbSeq < (ulong)(uVar20 - seqPos->idx)) {
      return 0xffffffffffffffc0;
    }
    puVar3 = (undefined8 *)((long)src + uVar21);
    if (puVar1 < puVar3) {
      pBVar11 = (cctx->seqStore).lit;
      pBVar19 = pBVar11;
      puVar26 = (undefined8 *)src;
      if (src <= puVar1) {
        pBVar19 = pBVar11 + ((long)puVar1 - (long)src);
        uVar14 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar11 = *src;
        *(undefined8 *)(pBVar11 + 8) = uVar14;
        puVar26 = puVar1;
        if (0x10 < (long)puVar1 - (long)src) {
          lVar24 = 0x10;
          do {
            uVar14 = ((undefined8 *)((long)src + lVar24))[1];
            pBVar4 = pBVar11 + lVar24;
            *(undefined8 *)pBVar4 = *(undefined8 *)((long)src + lVar24);
            *(undefined8 *)(pBVar4 + 8) = uVar14;
            puVar5 = (undefined8 *)((long)src + lVar24 + 0x10);
            uVar14 = puVar5[1];
            *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
            *(undefined8 *)(pBVar4 + 0x18) = uVar14;
            lVar24 = lVar24 + 0x20;
          } while (pBVar4 + 0x20 < pBVar19);
        }
      }
      if (puVar26 < puVar3) {
        lVar24 = 0;
        do {
          pBVar19[lVar24] = *(BYTE *)((long)puVar26 + lVar24);
          lVar24 = lVar24 + 1;
        } while ((long)puVar3 - (long)puVar26 != lVar24);
      }
    }
    else {
      pBVar19 = (cctx->seqStore).lit;
      uVar14 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar19 = *src;
      *(undefined8 *)(pBVar19 + 8) = uVar14;
      if (0x10 < uVar8) {
        pBVar19 = (cctx->seqStore).lit;
        uVar14 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar19 + 0x18) = uVar14;
        if (0x20 < uVar8) {
          lVar24 = 0;
          do {
            puVar3 = (undefined8 *)((long)src + lVar24 + 0x20);
            uVar14 = puVar3[1];
            pBVar11 = pBVar19 + lVar24 + 0x20;
            *(undefined8 *)pBVar11 = *puVar3;
            *(undefined8 *)(pBVar11 + 8) = uVar14;
            puVar3 = (undefined8 *)((long)src + lVar24 + 0x30);
            uVar14 = puVar3[1];
            *(undefined8 *)(pBVar11 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar11 + 0x18) = uVar14;
            lVar24 = lVar24 + 0x20;
          } while (pBVar11 + 0x20 < pBVar19 + uVar21);
        }
      }
    }
    ppBVar6 = &(cctx->seqStore).lit;
    *ppBVar6 = *ppBVar6 + uVar21;
    if (0xffff < uVar8) {
      (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
      (cctx->seqStore).longLengthPos =
           (U32)((ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart)
                >> 3);
    }
    psVar12 = (cctx->seqStore).sequences;
    psVar12->litLength = (U16)uVar8;
    psVar12->offset = uVar13 + 1;
    if (0xffff < uVar7 - 3) {
      (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
      (cctx->seqStore).longLengthPos =
           (U32)((ulong)((long)psVar12 - (long)(cctx->seqStore).sequencesStart) >> 3);
    }
    psVar12->matchLength = (U16)(uVar7 - 3);
    (cctx->seqStore).sequences = psVar12 + 1;
    src = (void *)((long)src + (ulong)(uVar8 + uVar7));
    uVar20 = uVar20 + 1;
  } while( true );
}

Assistant:

static size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                                             const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                                             const void* src, size_t blockSize) {
    U32 idx = seqPos->idx;
    BYTE const* ip = (BYTE const*)(src);
    const BYTE* const iend = ip + blockSize;
    repcodes_t updatedRepcodes;
    U32 dictSize;
    U32 litLength;
    U32 matchLength;
    U32 ll0;
    U32 offCode;

    if (cctx->cdict) {
        dictSize = (U32)cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = (U32)cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (; (inSeqs[idx].matchLength != 0 || inSeqs[idx].offset != 0) && idx < inSeqsSize; ++idx) {
        litLength = inSeqs[idx].litLength;
        matchLength = inSeqs[idx].matchLength;
        ll0 = litLength == 0;
        offCode = ZSTD_finalizeOffCode(inSeqs[idx].offset, updatedRepcodes.rep, ll0);
        updatedRepcodes = ZSTD_updateRep(updatedRepcodes.rep, offCode, ll0);

        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offCode, matchLength, litLength);
        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offCode, matchLength, seqPos->posInSrc,
                                                cctx->appliedParams.cParams.windowLog, dictSize,
                                                cctx->appliedParams.cParams.minMatch),
                                                "Sequence validation failed");
        }
        RETURN_ERROR_IF(idx - seqPos->idx > cctx->seqStore.maxNbSeq, memory_allocation,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offCode, matchLength - MINMATCH);
        ip += matchLength + litLength;
    }
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    if (inSeqs[idx].litLength) {
        DEBUGLOG(6, "Storing last literals of size: %u", inSeqs[idx].litLength);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, inSeqs[idx].litLength);
        ip += inSeqs[idx].litLength;
        seqPos->posInSrc += inSeqs[idx].litLength;
    }
    RETURN_ERROR_IF(ip != iend, corruption_detected, "Blocksize doesn't agree with block delimiter!");
    seqPos->idx = idx+1;
    return 0;
}